

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvector_manyvector.c
# Opt level: O1

void N_VDestroy_ManyVector(N_Vector v)

{
  void *pvVar1;
  long *plVar2;
  long lVar3;
  
  if (v != (N_Vector)0x0) {
    pvVar1 = v->content;
    if (pvVar1 != (void *)0x0) {
      if (((*(int *)((long)pvVar1 + 0x18) == 1) && (*(long *)((long)pvVar1 + 0x10) != 0)) &&
         (plVar2 = (long *)v->content, 0 < *plVar2)) {
        lVar3 = 0;
        do {
          N_VDestroy(*(undefined8 *)(plVar2[2] + lVar3 * 8));
          *(undefined8 *)(*(long *)((long)v->content + 0x10) + lVar3 * 8) = 0;
          lVar3 = lVar3 + 1;
          plVar2 = (long *)v->content;
        } while (lVar3 < *plVar2);
      }
      free(*(void **)((long)v->content + 0x10));
      pvVar1 = v->content;
      *(undefined8 *)((long)pvVar1 + 0x10) = 0;
      free(pvVar1);
      v->content = (void *)0x0;
    }
    if (v->ops != (N_Vector_Ops)0x0) {
      free(v->ops);
      v->ops = (N_Vector_Ops)0x0;
    }
    free(v);
    return;
  }
  return;
}

Assistant:

void MVAPPEND(N_VDestroy)(N_Vector v)
{
  SUNFunctionBegin(v->sunctx);

  sunindextype i;

  if (v == NULL) { return; }

  /* free content */
  if (v->content != NULL)
  {
    /* if subvectors are owned by v, then Destroy those */
    if ((MANYVECTOR_OWN_DATA(v) == SUNTRUE) && (MANYVECTOR_SUBVECS(v) != NULL))
    {
      for (i = 0; i < MANYVECTOR_NUM_SUBVECS(v); i++)
      {
        N_VDestroy(MANYVECTOR_SUBVEC(v, i));
        MANYVECTOR_SUBVEC(v, i) = NULL;
      }
    }

    /* free subvector array */
    free(MANYVECTOR_SUBVECS(v));
    MANYVECTOR_SUBVECS(v) = NULL;

#ifdef MANYVECTOR_BUILD_WITH_MPI
    /* free communicator */
    if (MANYVECTOR_COMM(v) != MPI_COMM_NULL)
    {
      SUNCheckMPICallVoid(MPI_Comm_free(&(MANYVECTOR_COMM(v))));
    }
    MANYVECTOR_COMM(v) = MPI_COMM_NULL;
#endif

    /* free content structure */
    free(v->content);
    v->content = NULL;
  }

  /* free ops and vector */
  if (v->ops != NULL)
  {
    free(v->ops);
    v->ops = NULL;
  }
  free(v);
  v = NULL;

  return;
}